

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_l10n.c
# Opt level: O2

void test_l10n_simple(CuTest *tc)

{
  char *actual;
  l10n_text txt;
  char buffer [32];
  
  txt.format = (char *)0x0;
  txt.refcount = 0;
  txt._12_4_ = 0;
  txt.args = (l10n_arg *)0x0;
  l10n_text_assign(&txt,"$name\'s blog (%num stars)","$name","Enno","%num",0x2a,0);
  actual = l10n_text_render(&txt,buffer,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x36,(char *)0x0,buffer,actual);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x37,(char *)0x0,"Enno\'s blog (42 stars)",buffer);
  l10n_text_free(&txt);
  return;
}

Assistant:

static void test_l10n_simple(CuTest * tc)
{
    char buffer[32];
    l10n_text txt = { NULL, 0, 0 };

    l10n_text_assign(&txt, "$name's blog (%num stars)", "$name", "Enno", "%num", 42, NULL);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(&txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "Enno's blog (42 stars)", buffer);
    l10n_text_free(&txt);
}